

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_watch_file_exact_path(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  
  puVar2 = uv_default_loop();
  remove("watch_dir/file.js");
  remove("watch_dir/file.jsx");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file.js");
  create_file("watch_dir/file.jsx");
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir/file.jsx",0);
    if (iVar1 != 0) goto LAB_0014e578;
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 != 0) goto LAB_0014e57d;
    iVar1 = uv_timer_start(&timer,timer_cb_exact,100,100);
    if (iVar1 != 0) goto LAB_0014e582;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0014e587;
    if (timer_cb_exact_called == 2) {
      remove("watch_dir/file.js");
      remove("watch_dir/file.jsx");
      remove("watch_dir/");
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014e591;
    }
  }
  else {
    run_test_fs_event_watch_file_exact_path_cold_1();
LAB_0014e578:
    run_test_fs_event_watch_file_exact_path_cold_2();
LAB_0014e57d:
    run_test_fs_event_watch_file_exact_path_cold_3();
LAB_0014e582:
    run_test_fs_event_watch_file_exact_path_cold_4();
LAB_0014e587:
    run_test_fs_event_watch_file_exact_path_cold_5();
  }
  run_test_fs_event_watch_file_exact_path_cold_6();
LAB_0014e591:
  run_test_fs_event_watch_file_exact_path_cold_7();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,0x4a,"0 && \"should never be called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_file_exact_path) {
  /*
    This test watches a file named "file.jsx" and modifies a file named
    "file.js". The test verifies that no events occur for file.jsx.
  */

#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  /* Setup */
  remove("watch_dir/file.js");
  remove("watch_dir/file.jsx");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file.js");
  create_file("watch_dir/file.jsx");
#if defined(__APPLE__) && !defined(MAC_OS_X_VERSION_10_12)
  /* Empirically, FSEvents seems to (reliably) report the preceeding
   * create_file events prior to macOS 10.11.6 in the subsequent fs_watch
   * creation, but that behavior hasn't been observed to occur on newer
   * versions. Give a long delay here to let the system settle before running
   * the test. */
  uv_sleep(1100);
  uv_update_time(loop);
#endif

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_fail, "watch_dir/file.jsx", 0);
  ASSERT(r == 0);
  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, timer_cb_exact, 100, 100);
  ASSERT(r == 0);
  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(timer_cb_exact_called == 2);

  /* Cleanup */
  remove("watch_dir/file.js");
  remove("watch_dir/file.jsx");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}